

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O3

bool sptk::ReadStream(SymmetricMatrix *matrix_to_read,istream *input_stream)

{
  double dVar1;
  uint num_row;
  bool bVar2;
  double *pdVar3;
  int i;
  ulong uVar4;
  int j;
  long lVar5;
  long lVar6;
  Matrix matrix;
  Row local_88;
  Matrix local_70;
  
  if (matrix_to_read == (SymmetricMatrix *)0x0) {
    bVar2 = false;
  }
  else {
    num_row = matrix_to_read->num_dimension_;
    Matrix::Matrix(&local_70,num_row,num_row);
    bVar2 = ReadStream(&local_70,input_stream);
    if (bVar2 && 0 < (int)num_row) {
      lVar6 = 1;
      uVar4 = 0;
      do {
        lVar5 = 0;
        do {
          dVar1 = local_70.index_.super__Vector_base<double_*,_std::allocator<double_*>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar4][lVar5];
          local_88._vptr_Row = (_func_int **)&PTR__Row_00110cf8;
          local_88.row_ = (int)uVar4;
          local_88.matrix_ = matrix_to_read;
          pdVar3 = SymmetricMatrix::Row::operator[](&local_88,(int)lVar5);
          *pdVar3 = dVar1;
          lVar5 = lVar5 + 1;
        } while (lVar6 != lVar5);
        uVar4 = uVar4 + 1;
        lVar6 = lVar6 + 1;
      } while (uVar4 != num_row);
    }
    Matrix::~Matrix(&local_70);
  }
  return bVar2;
}

Assistant:

bool ReadStream(sptk::SymmetricMatrix* matrix_to_read,
                std::istream* input_stream) {
  if (NULL == matrix_to_read) {
    return false;
  }

  const int dim(matrix_to_read->GetNumDimension());
  sptk::Matrix matrix(dim, dim);
  if (!sptk::ReadStream(&matrix, input_stream)) {
    return false;
  }

  for (int i(0); i < dim; ++i) {
    for (int j(0); j <= i; ++j) {
      (*matrix_to_read)[i][j] = matrix[i][j];
    }
  }

  return true;
}